

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O0

void __thiscall llbuild::buildsystem::Tool::~Tool(Tool *this)

{
  Tool *this_local;
  
  this->_vptr_Tool = (_func_int **)&PTR__Tool_00378a38;
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

Tool::~Tool() {}